

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void timeout_process(event_base *base)

{
  int iVar1;
  event *ev_00;
  event *ev;
  timeval now;
  event_base *base_local;
  
  now.tv_usec = (__suseconds_t)base;
  iVar1 = min_heap_empty_(&base->timeheap);
  if (iVar1 == 0) {
    gettime((event_base *)now.tv_usec,(timeval *)&ev);
    while (ev_00 = min_heap_top_((min_heap_t *)(now.tv_usec + 0x148)), ev_00 != (event *)0x0) {
      if ((event *)(ev_00->ev_timeout).tv_sec == ev) {
        if (now.tv_sec < (ev_00->ev_timeout).tv_usec) {
          return;
        }
      }
      else if ((long)ev < (ev_00->ev_timeout).tv_sec) {
        return;
      }
      event_del_nolock_(ev_00,0);
      if (event_debug_logging_mask_ != 0) {
        event_debugx_("timeout_process: event: %p, call %p",ev_00,
                      (ev_00->ev_evcallback).evcb_cb_union.evcb_callback);
      }
      event_active_nolock_(ev_00,1,1);
    }
  }
  return;
}

Assistant:

static void
timeout_process(struct event_base *base)
{
	/* Caller must hold lock. */
	struct timeval now;
	struct event *ev;

	if (min_heap_empty_(&base->timeheap)) {
		return;
	}

	gettime(base, &now);

	while ((ev = min_heap_top_(&base->timeheap))) {
		if (evutil_timercmp(&ev->ev_timeout, &now, >))
			break;

		/* delete this event from the I/O queues */
		event_del_nolock_(ev, EVENT_DEL_NOBLOCK);

		event_debug(("timeout_process: event: %p, call %p",
			 ev, ev->ev_callback));
		event_active_nolock_(ev, EV_TIMEOUT, 1);
	}
}